

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O2

void sysbvm_jit_jumpRelative(sysbvm_bytecodeJit_t *jit,size_t targetPC)

{
  sysbvm_bytecodeJitPCRelocation_t relocation_00;
  size_t sVar1;
  uint8_t instruction [5];
  sysbvm_bytecodeJitPCRelocation_t relocation;
  
  instruction[4] = '\0';
  instruction[0] = 0xe9;
  instruction[1] = '\0';
  instruction[2] = '\0';
  instruction[3] = '\0';
  sVar1 = sysbvm_bytecodeJit_addBytes(jit,5,instruction);
  relocation_00.targetPC = targetPC;
  relocation_00.offset = sVar1 - 4;
  relocation_00.addend = -4;
  sysbvm_bytecodeJit_addPCRelocation(jit,relocation_00);
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_jumpRelative(sysbvm_bytecodeJit_t *jit, size_t targetPC)
{
    uint8_t instruction[] = {
        0xE9, 0x00, 0x00, 0x00, 0x00,
    };

    size_t relocationOffset = sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction) - 4;
    sysbvm_bytecodeJitPCRelocation_t relocation = {
        .offset = relocationOffset,
        .targetPC = targetPC,
        .addend = -4,
    };
    sysbvm_bytecodeJit_addPCRelocation(jit, relocation);
}